

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  mapped_type mVar1;
  NeuralNetworkLayer *pNVar2;
  bool bVar3;
  string *psVar4;
  mapped_type *pmVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string err;
  _Self local_c8;
  reference local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  _Self local_98;
  mapped_type local_90;
  allocator<char> local_89;
  int rank;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar3;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,2,-1);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar3;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar2 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Split",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar2,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar2 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&rank,"Split",&local_89);
        validateRankCount(__return_storage_ptr__,pNVar2,(string *)&rank,3,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&rank);
        std::allocator<char>::~allocator(&local_89);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar3;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_90 = 0;
        psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_(local_20,0);
        local_98._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&this->blobNameToRank,psVar4);
        __range2 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::end(&this->blobNameToRank);
        bVar3 = std::operator!=(&local_98,(_Self *)&__range2);
        if (!bVar3) {
          Result::Result(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        psVar4 = Specification::NeuralNetworkLayer::output_abi_cxx11_(local_20,0);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,psVar4);
        local_90 = *pmVar5;
        this_00 = Specification::NeuralNetworkLayer::output_abi_cxx11_(local_20);
        __end2 = google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::begin(this_00);
        output = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::end(this_00);
        while (bVar3 = google::protobuf::internal::
                       RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator!=(&__end2,(iterator *)&output), bVar3) {
          local_c0 = google::protobuf::internal::
                     RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&this->blobNameToRank,local_c0);
          err.field_2._8_8_ =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::end(&this->blobNameToRank);
          bVar3 = std::operator!=(&local_c8,(_Self *)((long)&err.field_2 + 8));
          mVar1 = local_90;
          if ((bVar3) &&
             (pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::at(&this->blobNameToRank,local_c0), mVar1 != *pmVar5)) {
            std::__cxx11::string::string((string *)local_f0);
            psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::__cxx11::string::string((string *)&local_150,(string *)psVar4);
            std::operator+(&local_130,"Layer \'",&local_150);
            std::operator+(&local_110,&local_130,
                           "\' of type \'Split\' must have equal ranks for its outputs, but they are not equal."
                          );
            std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_150);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f0);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_f0);
            return __return_storage_ptr__;
          }
          google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));

    // between 2 and any number of outputs
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Split", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Split", 3, -1, blobNameToRank));

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return Result();
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}